

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_impls.cxx
# Opt level: O2

void __thiscall
dummy_state_machine::commit
          (dummy_state_machine *this,ulong param_1,buffer *data,uptr<log_entry_cookie> *param_3)

{
  ostream *poVar1;
  byte *pbVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"commit message:");
  pbVar2 = cornerstone::buffer::data(data);
  poVar1 = std::operator<<(poVar1,(char *)pbVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

virtual void commit(const ulong, buffer& data, const uptr<log_entry_cookie>&)
    {
        std::cout << "commit message:" << reinterpret_cast<const char*>(data.data()) << std::endl;
    }